

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::WriteComment(ostream *os,string *comment)

{
  long lVar1;
  ostream *poVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (comment->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"\n#############################################\n",0x2f);
    lVar1 = std::__cxx11::string::find((char)comment,10);
    if (lVar1 != -1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)comment);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        lVar1 = std::__cxx11::string::find((char)comment,10);
      } while (lVar1 != -1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)comment);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n",2);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}